

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O0

int Gia_ManMarkAutonomous_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    if ((*(ulong *)pObj >> 0x1e & 1) != 0) {
      __assert_fail("pObj->fMark0 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaRetime.c"
                    ,0x32,"int Gia_ManMarkAutonomous_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Gia_ObjIsPi(p,pObj);
    if ((iVar1 == 0) && (iVar1 = Gia_ObjIsConst0(pObj), iVar1 == 0)) {
      iVar1 = Gia_ObjIsCo(pObj);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin0(pObj);
        uVar2 = Gia_ManMarkAutonomous_rec(p,pGVar3);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | ((ulong)uVar2 & 1) << 0x1e;
        return (int)((ulong)uVar2 & 1);
      }
      iVar1 = Gia_ObjIsCi(pObj);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjRoToRi(p,pObj);
        uVar2 = Gia_ManMarkAutonomous_rec(p,pGVar3);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | ((ulong)uVar2 & 1) << 0x1e;
        return (int)((ulong)uVar2 & 1);
      }
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaRetime.c"
                      ,0x39,"int Gia_ManMarkAutonomous_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      iVar1 = Gia_ManMarkAutonomous_rec(p,pGVar3);
      if (iVar1 != 0) {
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | 0x40000000;
        return 1;
      }
      pGVar3 = Gia_ObjFanin1(pObj);
      uVar2 = Gia_ManMarkAutonomous_rec(p,pGVar3);
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | ((ulong)uVar2 & 1) << 0x1e;
      return (int)((ulong)uVar2 & 1);
    }
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | 0x40000000;
    p_local._4_4_ = 1;
  }
  else {
    p_local._4_4_ = (uint)(*(ulong *)pObj >> 0x1e) & 1;
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks objects reachables from Const0 and PIs/

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManMarkAutonomous_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( pObj->fMark0 == 0 );
    if ( Gia_ObjIsPi(p, pObj) || Gia_ObjIsConst0(pObj) )
        return pObj->fMark0 = 1;
    if ( Gia_ObjIsCo(pObj) )
        return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin0(pObj) );
    if ( Gia_ObjIsCi(pObj) )
        return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjRoToRi(p, pObj) );
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin0(pObj) ) )
        return pObj->fMark0 = 1;
    return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin1(pObj) );
}